

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O0

int xmlconfTestCases(xmlDocPtr doc,xmlNodePtr cur,int level)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint local_30;
  int output;
  int tests;
  int ret;
  xmlChar *profile;
  _xmlNode *p_Stack_18;
  int level_local;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  
  output = 0;
  local_30 = 0;
  bVar3 = false;
  profile._4_4_ = level;
  if (level == 1) {
    lVar2 = xmlGetProp(cur,"PROFILE");
    bVar3 = lVar2 != 0;
    if (bVar3) {
      profile._4_4_ = 2;
      printf("Test cases: %s\n",lVar2);
      (*_xmlFree)(lVar2);
    }
  }
  for (p_Stack_18 = cur->children; p_Stack_18 != (xmlNodePtr)0x0; p_Stack_18 = p_Stack_18->next) {
    if (p_Stack_18->type == XML_ELEMENT_NODE) {
      iVar1 = xmlStrEqual(p_Stack_18->name,"TESTCASES");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(p_Stack_18->name,"TEST");
        if (iVar1 == 0) {
          fprintf(_stderr,"Unhandled element %s\n",p_Stack_18->name);
        }
        else {
          iVar1 = xmlconfTestItem(doc,p_Stack_18);
          if (-1 < iVar1) {
            output = output + 1;
          }
          local_30 = local_30 + 1;
        }
      }
      else {
        iVar1 = xmlconfTestCases(doc,p_Stack_18,profile._4_4_);
        output = iVar1 + output;
      }
    }
  }
  if ((bVar3) && (0 < (int)local_30)) {
    printf("Test cases: %d tests\n",(ulong)local_30);
  }
  return output;
}

Assistant:

static int
xmlconfTestCases(xmlDocPtr doc, xmlNodePtr cur, int level) {
    xmlChar *profile;
    int ret = 0;
    int tests = 0;
    int output = 0;

    if (level == 1) {
	profile = xmlGetProp(cur, BAD_CAST "PROFILE");
	if (profile != NULL) {
	    output = 1;
	    level++;
	    printf("Test cases: %s\n", (char *) profile);
	    xmlFree(profile);
	}
    }
    cur = cur->children;
    while (cur != NULL) {
        /* look only at elements we ignore everything else */
        if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlStrEqual(cur->name, BAD_CAST "TESTCASES")) {
	        ret += xmlconfTestCases(doc, cur, level);
	    } else if (xmlStrEqual(cur->name, BAD_CAST "TEST")) {
	        if (xmlconfTestItem(doc, cur) >= 0)
		    ret++;
		tests++;
	    } else {
	        fprintf(stderr, "Unhandled element %s\n", (char *)cur->name);
	    }
	}
        cur = cur->next;
    }
    if (output == 1) {
	if (tests > 0)
	    printf("Test cases: %d tests\n", tests);
    }
    return(ret);
}